

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O0

MessageProcessingResult __thiscall
helics::ForwardingTimeCoordinator::checkExecEntry
          (ForwardingTimeCoordinator *this,GlobalFederateId param_2)

{
  bool bVar1;
  reference pDVar2;
  long in_RDI;
  ActionMessage execgrant;
  DependencyInfo *dep;
  iterator __end3;
  iterator __begin3;
  TimeDependencies *__range3;
  bool allowed;
  MessageProcessingResult ret;
  TimeDependencies *in_stack_fffffffffffffed8;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  *in_stack_fffffffffffffee0;
  ActionMessage *this_00;
  undefined4 in_stack_fffffffffffffef8;
  action_t in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  GlobalFederateId in_stack_ffffffffffffff04;
  GlobalFederateId GVar3;
  GlobalFederateId local_f0;
  bool in_stack_ffffffffffffff26;
  bool in_stack_ffffffffffffff27;
  Time in_stack_ffffffffffffff28;
  Time in_stack_ffffffffffffff30;
  Time in_stack_ffffffffffffff38;
  GlobalFederateId in_stack_ffffffffffffff44;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_28;
  long local_20;
  byte local_12;
  MessageProcessingResult local_11;
  MessageProcessingResult local_1;
  
  local_11 = CONTINUE_PROCESSING;
  bVar1 = TimeDependencies::checkIfReadyForExecEntry
                    ((TimeDependencies *)in_stack_ffffffffffffff28.internalTimeCode,
                     in_stack_ffffffffffffff27,in_stack_ffffffffffffff26);
  if (!bVar1) {
    local_12 = 0;
    if (*(char *)(in_RDI + 0xe0) == '\x02') {
      local_12 = 1;
      local_20 = in_RDI + 8;
      local_28._M_current = (DependencyInfo *)TimeDependencies::begin(in_stack_fffffffffffffed8);
      TimeDependencies::end(in_stack_fffffffffffffed8);
      while (bVar1 = __gnu_cxx::
                     operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               (in_stack_fffffffffffffee0,
                                (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                 *)in_stack_fffffffffffffed8), ((bVar1 ^ 0xffU) & 1) != 0) {
        pDVar2 = __gnu_cxx::
                 __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                 ::operator*(&local_28);
        if ((pDVar2->dependency & 1U) != 0) {
          bVar1 = GlobalFederateId::operator!=
                            (&(pDVar2->super_TimeData).minFed,
                             (GlobalFederateId)*(BaseType *)(in_RDI + 0x48));
          if (bVar1) {
            local_12 = 0;
            break;
          }
          if ((pDVar2->super_TimeData).responseSequenceCounter != *(int *)(in_RDI + 0xec)) {
            local_12 = 0;
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
        ::operator++(&local_28);
      }
    }
    if ((local_12 & 1) == 0) {
      return local_11;
    }
  }
  *(undefined1 *)(in_RDI + 0x53) = 1;
  local_11 = NEXT_STEP;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined1 *)(in_RDI + 0xe0) = 5;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  this_00 = (ActionMessage *)&stack0xffffffffffffff08;
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff04.gid,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc);
  local_f0.gid = *(BaseType *)(in_RDI + 0x48);
  GVar3.gid = 0;
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff04);
  transmitTimingMessagesDownstream
            ((ForwardingTimeCoordinator *)in_stack_ffffffffffffff38.internalTimeCode,
             (ActionMessage *)in_stack_ffffffffffffff30.internalTimeCode,in_stack_ffffffffffffff44);
  transmitTimingMessagesUpstream
            ((ForwardingTimeCoordinator *)CONCAT44(GVar3.gid,in_stack_ffffffffffffff00),
             (ActionMessage *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_1 = local_11;
  ActionMessage::~ActionMessage(this_00);
  return local_1;
}

Assistant:

MessageProcessingResult ForwardingTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;

    if (!dependencies.checkIfReadyForExecEntry(false, false)) {
        bool allowed{false};
        if (downstream.mTimeState == TimeState::exec_requested_iterative) {
            allowed = true;
            for (auto& dep : dependencies) {
                if (dep.dependency) {
                    if (dep.minFed != mSourceId) {
                        allowed = false;
                        break;
                    }
                    if (dep.responseSequenceCounter != downstream.sequenceCounter) {
                        allowed = false;
                        break;
                    }
                }
            }
        }
        if (!allowed) {
            return ret;
        }
    }
    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    downstream.next = timeZero;
    downstream.mTimeState = TimeState::time_granted;
    downstream.minDe = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}